

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::SimpleTimeZone::getOffsetFromLocal
          (SimpleTimeZone *this,UDate date,int32_t nonExistingTimeOpt,int32_t duplicatedTimeOpt,
          int32_t *rawOffsetGMT,int32_t *savingsDST,UErrorCode *status)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int *piVar4;
  int8_t iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  int *local_48;
  int *local_40;
  ulong local_38;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_40 = savingsDST;
  iVar6 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[8])();
  *rawOffsetGMT = iVar6;
  dVar9 = uprv_floor_63(date / 86400000.0);
  local_38 = (ulong)(uint)(int)(date - dVar9 * 86400000.0);
  local_48 = rawOffsetGMT;
  Grego::dayToFields(dVar9,&year,&month,&dom,&dow);
  iVar3 = year;
  iVar2 = month;
  iVar1 = dom;
  uVar8 = (ulong)(byte)dow;
  iVar5 = Grego::monthLength(year,month);
  piVar4 = local_48;
  iVar7 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                    (this,1,(ulong)(uint)iVar3,(ulong)(uint)iVar2,(ulong)(uint)iVar1,uVar8,local_38,
                     (ulong)(uint)(int)iVar5,status);
  iVar6 = *piVar4;
  *local_40 = iVar7 - iVar6;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (iVar7 - iVar6 < 1) {
      if ((duplicatedTimeOpt & 3U) == 1) {
        return;
      }
      if (((duplicatedTimeOpt & 3U) != 3) && ((duplicatedTimeOpt & 0xcU) != 4)) {
        return;
      }
    }
    else if ((nonExistingTimeOpt & 3U) != 1) {
      if ((nonExistingTimeOpt & 3U) == 3) {
        return;
      }
      if ((~nonExistingTimeOpt & 0xcU) == 0) {
        return;
      }
    }
    iVar6 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xd])(this);
    dVar9 = uprv_floor_63((date - (double)iVar6) / 86400000.0);
    Grego::dayToFields(dVar9,&year,&month,&dom,&dow);
    iVar5 = Grego::monthLength(year,month);
    iVar6 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                      (this,1,(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)dom,(ulong)(byte)dow
                       ,(ulong)(uint)(int)((date - (double)iVar6) - dVar9 * 86400000.0),
                       (ulong)(uint)(int)iVar5,status);
    *local_40 = iVar6 - *local_48;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }